

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

void Spl_ManWinFindLeavesRoots(Spl_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int i;
  
  p->vLeaves->nSize = 0;
  for (iVar6 = 0; iVar6 < p->vAnds->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p->vAnds,iVar6);
    pGVar4 = Gia_ManObj(p->pGia,iVar2);
    iVar3 = Vec_BitEntry(p->vMarksAnd,iVar2);
    if (iVar3 == 0) {
      __assert_fail("Vec_BitEntry(p->vMarksAnd, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                    ,0xd0,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
    }
    i = iVar2 - (*(uint *)pGVar4 & 0x1fffffff);
    iVar3 = Vec_BitEntry(p->vMarksAnd,i);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsLut2(p->pGia,i);
      if ((iVar3 == 0) && (iVar3 = Vec_BitEntry(p->vMarksCIO,i), iVar3 == 0)) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0xd4,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      Vec_BitWriteEntry(p->vMarksAnd,i,1);
      Vec_IntPush(p->vLeaves,i);
    }
    iVar2 = iVar2 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
    iVar3 = Vec_BitEntry(p->vMarksAnd,iVar2);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsLut2(p->pGia,iVar2);
      if ((iVar3 == 0) && (iVar3 = Vec_BitEntry(p->vMarksCIO,iVar2), iVar3 == 0)) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0xdb,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      Vec_BitWriteEntry(p->vMarksAnd,iVar2,1);
      Vec_IntPush(p->vLeaves,iVar2);
    }
  }
  for (iVar6 = 0; iVar6 < p->vLeaves->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p->vLeaves,iVar6);
    Vec_BitWriteEntry(p->vMarksAnd,iVar2,0);
  }
  p->vRoots->nSize = 0;
  for (iVar6 = 0; iVar6 < p->vNodes->nSize; iVar6 = iVar6 + 1) {
    pVVar1 = p->pGia->vMapping2;
    iVar2 = Vec_IntEntry(p->vNodes,iVar6);
    pVVar5 = Vec_WecEntry(pVVar1,iVar2);
    if (pVVar5 == (Vec_Int_t *)0x0) break;
    for (iVar2 = 0; iVar2 < pVVar5->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar5,iVar2);
      Gia_ObjLutRefDecId(p->pGia,iVar3);
    }
  }
  for (iVar6 = 0; iVar6 < p->vAnds->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p->vAnds,iVar6);
    iVar3 = Gia_ObjLutRefNumId(p->pGia,iVar2);
    if (iVar3 != 0) {
      Vec_IntPush(p->vRoots,iVar2);
    }
  }
  iVar6 = 0;
  while( true ) {
    if (p->vNodes->nSize <= iVar6) {
      return;
    }
    pVVar1 = p->pGia->vMapping2;
    iVar2 = Vec_IntEntry(p->vNodes,iVar6);
    pVVar5 = Vec_WecEntry(pVVar1,iVar2);
    if (pVVar5 == (Vec_Int_t *)0x0) break;
    for (iVar2 = 0; iVar2 < pVVar5->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar5,iVar2);
      Gia_ObjLutRefIncId(p->pGia,iVar3);
    }
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

void Spl_ManWinFindLeavesRoots( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int iObj, iFan, i, k;
    // collect leaves
/*
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
    {
        assert( Vec_BitEntry(p->vMarksNo, iObj) );
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) )
            {
                Vec_BitWriteEntry(p->vMarksNo, iFan, 1);
                Vec_IntPush( p->vLeaves, iFan );
            }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksNo, iFan, 0);
*/
    Vec_IntClear( p->vLeaves );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
        assert( Vec_BitEntry(p->vMarksAnd, iObj) );
        iFan = Gia_ObjFaninId0( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
        iFan = Gia_ObjFaninId1( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksAnd, iFan, 0);

    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) )
            Vec_IntPush( p->vRoots, iObj );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
}